

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingC.c
# Opt level: O0

size_t cmsysEncoding_wcstombs(char *dest,wchar_t *str,size_t n)

{
  size_t n_local;
  wchar_t *str_local;
  char *dest_local;
  
  if (str == (wchar_t *)0x0) {
    dest_local = (char *)0xffffffffffffffff;
  }
  else {
    dest_local = (char *)wcstombs(dest,str,n);
  }
  return (size_t)dest_local;
}

Assistant:

size_t kwsysEncoding_wcstombs(char* dest, const wchar_t* str, size_t n)
{
  if(str == 0)
    {
    return (size_t)-1;
    }
#ifdef _WIN32
  return WideCharToMultiByte(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str, -1,
                             dest, (int)n, NULL, NULL) - 1;
#else
  return wcstombs(dest, str, n);
#endif
}